

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O1

node_t __thiscall lsim::Simulator::merge_nodes(Simulator *this,node_t node_a,node_t node_b)

{
  pointer pNVar1;
  pointer puVar2;
  iterator __position;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  pin_container_t *this_00;
  uint *pin;
  uint *__args;
  
  if (node_a != node_b) {
    release_node(this,node_b);
    pNVar1 = (this->m_node_metadata).
             super__Vector_base<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = &pNVar1[node_a].m_pins;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (this_00,((long)*(pointer *)
                               ((long)&pNVar1[node_b].m_pins.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl + 8) -
                        *(long *)&pNVar1[node_b].m_pins.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl >> 2) +
                       ((long)*(pointer *)
                               ((long)&pNVar1[node_a].m_pins.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl + 8) -
                        *(long *)&(this_00->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl >> 2));
    puVar2 = *(pointer *)
              ((long)&pNVar1[node_b].m_pins.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8);
    for (__args = *(uint **)&pNVar1[node_b].m_pins.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        ; __args != puVar2; __args = __args + 1) {
      __position._M_current =
           *(pointer *)
            ((long)&pNVar1[node_a].m_pins.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8);
      if (__position._M_current ==
          *(pointer *)
           ((long)&pNVar1[node_a].m_pins.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 0x10))
      {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        *(uint **)((long)&pNVar1[node_a].m_pins.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                  8) = __position._M_current + 1;
      }
      (this->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[*__args] = node_a;
    }
    p_Var3 = *(_Base_ptr *)((long)&pNVar1[node_b].m_dependents._M_t._M_impl + 0x18);
    p_Var4 = (_Base_ptr)((long)&pNVar1[node_b].m_dependents._M_t._M_impl + 8);
    if (p_Var3 != p_Var4) {
      do {
        std::
        _Rb_tree<lsim::SimComponent*,lsim::SimComponent*,std::_Identity<lsim::SimComponent*>,std::less<lsim::SimComponent*>,std::allocator<lsim::SimComponent*>>
        ::_M_insert_unique<lsim::SimComponent*const&>
                  ((_Rb_tree<lsim::SimComponent*,lsim::SimComponent*,std::_Identity<lsim::SimComponent*>,std::less<lsim::SimComponent*>,std::allocator<lsim::SimComponent*>>
                    *)&pNVar1[node_a].m_dependents,(SimComponent **)(p_Var3 + 1));
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while (p_Var3 != p_Var4);
    }
    return node_a;
  }
  __assert_fail("node_a != node_b",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0xb7,"node_t lsim::Simulator::merge_nodes(node_t, node_t)");
}

Assistant:

node_t Simulator::merge_nodes(node_t node_a, node_t node_b) {
    assert(node_a != node_b);
    release_node(node_b);
	
	auto& meta_a = m_node_metadata[node_a];
	auto& meta_b = m_node_metadata[node_b];
	
	meta_a.m_pins.reserve(meta_a.m_pins.size() + meta_b.m_pins.size());
	for (const auto& pin : meta_b.m_pins) {
		meta_a.m_pins.push_back(pin);
		m_pin_nodes[pin] = node_a;
	}

    for (const auto &comp : meta_b.m_dependents) {
        meta_a.m_dependents.insert(comp);
    }

    return node_a;
}